

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O0

string * RankSerialize(string *__return_storage_ptr__,
                      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>
                      *list)

{
  string local_58 [8];
  value_type rank;
  iterator __end1;
  iterator __begin1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>
  *__range1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>
  *list_local;
  string *serialized;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>
           ::begin(list);
  rank.field_2._8_8_ =
       std::
       array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_9UL>::
       end(list);
  for (; __end1 != (iterator)rank.field_2._8_8_; __end1 = __end1 + 1) {
    std::__cxx11::string::string(local_58,(string *)__end1);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RankSerialize(std::array<std::string, 9> list)
{
	std::string serialized;

	UTIL_FOREACH(list, rank)
	{
		serialized.append(rank);
		serialized.append(",");
	}

	return serialized;
}